

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void writelonglong(char *outfile,LONGLONG a)

{
  char local_24 [8];
  uchar b [8];
  int i;
  LONGLONG a_local;
  char *outfile_local;
  
  b[0] = '\a';
  b[1] = '\0';
  b[2] = '\0';
  b[3] = '\0';
  unique0x1000006d = a;
  for (; -1 < (int)b._0_4_; b._0_4_ = b._0_4_ + -1) {
    local_24[(int)b._0_4_] = (char)stack0xffffffffffffffe8;
    register0x00000000 = stack0xffffffffffffffe8 >> 8;
  }
  b[0] = '\0';
  b[1] = '\0';
  b[2] = '\0';
  b[3] = '\0';
  for (; (int)b._0_4_ < 8; b._0_4_ = b._0_4_ + 1) {
    qwrite(outfile,local_24 + (int)b._0_4_,1);
  }
  return;
}

Assistant:

static void
writelonglong(char *outfile, LONGLONG a)
{
int i;
unsigned char b[8];

	/* Write integer A one byte at a time to outfile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 */
	for (i=7; i>=0; i--) {
		b[i] = (unsigned char) (a & 0x000000ff);
		a >>= 8;
	}
	for (i=0; i<8; i++) qwrite(outfile, (char *) &b[i],1);
}